

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scan.cpp
# Opt level: O1

void test_exclusive_scan<std::__cxx11::string,std::plus<std::__cxx11::string>>(uint W)

{
  int *piVar1;
  code *pcVar2;
  double dVar3;
  uint uVar4;
  pointer pbVar5;
  pointer pbVar6;
  pointer pbVar7;
  pointer puVar8;
  pointer puVar9;
  char extraout_AL;
  bool bVar10;
  char extraout_AL_00;
  int iVar11;
  pointer *__ptr;
  default_delete<tf::Node> *this;
  Executor *this_00;
  long lVar12;
  uint uVar13;
  ulong __n;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 uVar14;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 uVar15;
  in_place_type_t<tf::Node::Static> local_3f2;
  DefaultTaskParams local_3f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> init;
  string __str;
  anon_union_24_2_13149d16_for_String_2 aStack_388;
  undefined1 local_370;
  char *local_368;
  char *local_360;
  Expression_lhs<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  local_358;
  Result local_348;
  Task task2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  input;
  Task alloc;
  iterator dbeg;
  iterator send;
  iterator sbeg;
  long *local_2e0 [2];
  long local_2d0 [2];
  long *local_2c0 [2];
  long local_2b0 [2];
  long *local_2a0 [2];
  long local_290 [2];
  Task task1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  golden;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  output;
  shared_ptr<tf::WorkerInterface> local_248;
  Taskflow taskflow;
  Executor executor;
  
  local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,(ulong)W,&local_248);
  if (local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  taskflow.super_FlowBuilder._graph = &taskflow._graph;
  taskflow._mutex.super___mutex_base._M_mutex.__align = 0;
  taskflow._mutex.super___mutex_base._M_mutex._8_8_ = 0;
  taskflow._mutex.super___mutex_base._M_mutex._16_8_ = 0;
  taskflow._mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  taskflow._mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  taskflow._name._M_dataplus._M_p = (pointer)&taskflow._name.field_2;
  taskflow._name._M_string_length = 0;
  taskflow._name.field_2._M_local_buf[0] = '\0';
  taskflow._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  taskflow._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  taskflow._graph.
  super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  .
  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  taskflow._topologies.c.
  super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
  _M_initialize_map((_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
                     *)&taskflow._topologies,0);
  taskflow._satellite.super__Optional_base<std::_List_iterator<tf::Taskflow>,_true,_true>._M_payload
  .super__Optional_payload_base<std::_List_iterator<tf::Taskflow>_>._M_engaged = false;
  __n = 0;
  while( true ) {
    puVar9 = taskflow._graph.
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             .
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar8 = taskflow._graph.
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             .
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    this = (default_delete<tf::Node> *)
           taskflow._graph.
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           .
           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    if (taskflow._graph.
        super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        .
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        taskflow._graph.
        super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        .
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      do {
        if (*(Node **)this != (Node *)0x0) {
          std::default_delete<tf::Node>::operator()(this,*(Node **)this);
        }
        *(undefined8 *)this = 0;
        this = this + 8;
      } while (this != (default_delete<tf::Node> *)puVar9);
      taskflow._graph.
      super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      .
      super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = puVar8;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&input,__n,(allocator_type *)&__str);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&output,__n,(allocator_type *)&__str);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&golden,__n,(allocator_type *)&__str);
    sbeg._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    send._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    dbeg._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (__n != 0) {
      lVar12 = 0;
      do {
        iVar11 = rand();
        uVar13 = iVar11 % 10;
        __str._M_dataplus._M_p = (pointer)&__str.field_2;
        std::__cxx11::string::_M_construct((ulong)&__str,'\x01' - (char)((int)uVar13 >> 0x1f));
        uVar4 = -uVar13;
        if (0 < (int)uVar13) {
          uVar4 = uVar13;
        }
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (__str._M_dataplus._M_p + (uVar13 >> 0x1f),1,uVar4);
        std::__cxx11::string::operator=
                  ((string *)
                   ((long)&((input.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar12)
                   ,(string *)&__str);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != &__str.field_2) {
          operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
        }
        lVar12 = lVar12 + 0x20;
      } while (__n << 5 != lVar12);
    }
    init._M_string_length = 0;
    init.field_2._M_local_buf[0] = '\0';
    init._M_dataplus._M_p = (pointer)&init.field_2;
    iVar11 = rand();
    uVar13 = iVar11 % 10;
    __str._M_dataplus._M_p = (pointer)&__str.field_2;
    std::__cxx11::string::_M_construct((ulong)&__str,'\x01' - (char)((int)uVar13 >> 0x1f));
    uVar4 = -uVar13;
    if (0 < (int)uVar13) {
      uVar4 = uVar13;
    }
    std::__detail::__to_chars_10_impl<unsigned_int>
              (__str._M_dataplus._M_p + (uVar13 >> 0x1f),1,uVar4);
    std::__cxx11::string::operator=((string *)&init,(string *)&__str);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != &__str.field_2) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    pbVar7 = golden.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar6 = input.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar5 = input.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_2a0[0] = local_290;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2a0,init._M_dataplus._M_p,
               init._M_dataplus._M_p + init._M_string_length);
    std::
    exclusive_scan<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string,std::plus<std::__cxx11::string>>
              (pbVar5,pbVar6,pbVar7,(string *)local_2a0);
    if (local_2a0[0] != local_290) {
      operator_delete(local_2a0[0],local_290[0] + 1);
    }
    pbVar7 = output.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar6 = input.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar5 = input.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_2c0[0] = local_2b0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2c0,init._M_dataplus._M_p,
               init._M_dataplus._M_p + init._M_string_length);
    tf::FlowBuilder::
    exclusive_scan<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string,std::plus<std::__cxx11::string>>
              ((FlowBuilder *)&task1,&taskflow,pbVar5,pbVar6,pbVar7,(string *)local_2c0);
    if (local_2c0[0] != local_2b0) {
      operator_delete(local_2c0[0],local_2b0[0] + 1);
    }
    __str._M_dataplus._M_p = (pointer)&sbeg;
    __str._M_string_length = (size_type)&input;
    __str.field_2._M_allocated_capacity = (size_type)&send;
    __str.field_2._8_8_ = &dbeg;
    local_348.m_passed = false;
    local_348._1_7_ = 0;
    local_358.lhs =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0;
    task2._node._0_4_ = 0;
    alloc._node = tf::Graph::
                  _emplace_back<int_const&,int_const&,tf::DefaultTaskParams,decltype(nullptr),decltype(nullptr),int,std::in_place_type_t<tf::Node::Static>,test_exclusive_scan<std::__cxx11::string,std::plus<std::__cxx11::string>>(unsigned_int)::_lambda()_1_>
                            (taskflow.super_FlowBuilder._graph,&tf::NSTATE::NONE,&tf::ESTATE::NONE,
                             &local_3f1,(void **)&local_348,&local_358.lhs,(int *)&task2,&local_3f2,
                             (anon_class_32_4_6a670194 *)&__str);
    local_2e0[0] = local_2d0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2e0,init._M_dataplus._M_p,
               init._M_dataplus._M_p + init._M_string_length);
    tf::FlowBuilder::
    exclusive_scan<std::reference_wrapper<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::reference_wrapper<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::reference_wrapper<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::__cxx11::string,std::plus<std::__cxx11::string>>
              ((FlowBuilder *)&task2,&taskflow,&sbeg,&send,&dbeg,local_2e0);
    if (local_2e0[0] != local_2d0) {
      operator_delete(local_2e0[0],local_2d0[0] + 1);
    }
    tf::Task::precede<tf::Task&>(&task1,&alloc);
    tf::Task::precede<tf::Task&>(&alloc,&task2);
    local_348.m_passed = true;
    local_348._1_7_ = 0;
    this_00 = &executor;
    tf::Executor::
    run_until<tf::Executor::run_n<tf::Executor::run(tf::Taskflow&)::_lambda()_1_>(tf::Taskflow&,unsigned_long,tf::Executor::run(tf::Taskflow&)::_lambda()_1_&&)::_lambda()_1_,tf::Executor::run(tf::Taskflow&)::_lambda()_1_>
              ((Future<void> *)&__str,this_00,&taskflow,(anon_class_8_1_69701ed9 *)&local_348,
               (anon_class_1_0_00000001 *)&local_358);
    if (__str._M_dataplus._M_p == (pointer)0x0) break;
    std::__future_base::_State_baseV2::wait((_State_baseV2 *)__str._M_dataplus._M_p,this_00);
    if (__str.field_2._8_8_ != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar1 = (int *)(__str.field_2._8_8_ + 0xc);
        iVar11 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
      }
      else {
        iVar11 = *(int *)(__str.field_2._8_8_ + 0xc);
        *(int *)(__str.field_2._8_8_ + 0xc) = iVar11 + -1;
      }
      if (iVar11 == 1) {
        (**(code **)(*(long *)__str.field_2._8_8_ + 0x18))();
      }
    }
    if (__str._M_string_length != 0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__str._M_string_length);
    }
    aStack_388.buf[0] = '\0';
    aStack_388.buf[0x17] = '\x17';
    __str._M_dataplus._M_p = *(pointer *)(doctest::detail::g_cs + 0x20);
    __str._M_string_length = CONCAT44(__str._M_string_length._4_4_,0xc);
    __str.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_61e93;
    __str.field_2._8_4_ = 0x142;
    local_370 = 0;
    local_368 = "";
    local_360 = "";
    local_358.lhs = &input;
    local_358.m_at = DT_REQUIRE;
    doctest::detail::
    Expression_lhs<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
    ::
    operator==<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_nullptr>
              (&local_348,&local_358,&golden);
    doctest::String::operator=((String *)&aStack_388.data,&local_348.m_decomp);
    bVar10 = local_348.m_passed;
    uVar14 = extraout_XMM0_Da;
    uVar15 = extraout_XMM0_Db;
    if ((local_348.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_348.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_348.m_decomp.field_0.data.ptr);
      uVar14 = extraout_XMM0_Da_00;
      uVar15 = extraout_XMM0_Db_00;
    }
    dVar3 = doctest::detail::ResultBuilder::log
                      ((ResultBuilder *)&__str,(double)CONCAT44(uVar15,uVar14));
    if (extraout_AL != '\0') {
      pcVar2 = (code *)swi(3);
      (*pcVar2)(SUB84(dVar3,0));
      return;
    }
    if (bVar10 == false) {
      bVar10 = doctest::detail::checkIfShouldThrow((Enum)__str._M_string_length);
      if (bVar10) goto LAB_00137e89;
    }
    if ((aStack_388.buf[0x17] < '\0') &&
       ((void *)CONCAT71(aStack_388._1_7_,aStack_388.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(aStack_388._1_7_,aStack_388.buf[0]));
    }
    aStack_388.buf[0] = '\0';
    aStack_388.buf[0x17] = '\x17';
    __str._M_dataplus._M_p = *(pointer *)(doctest::detail::g_cs + 0x20);
    __str._M_string_length = CONCAT44(__str._M_string_length._4_4_,0xc);
    __str.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_61e93;
    __str.field_2._8_4_ = 0x143;
    local_370 = 0;
    local_368 = "";
    local_360 = "";
    local_358.lhs = &output;
    local_358.m_at = DT_REQUIRE;
    doctest::detail::
    Expression_lhs<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
    ::
    operator==<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_nullptr>
              (&local_348,&local_358,&golden);
    doctest::String::operator=((String *)&aStack_388.data,&local_348.m_decomp);
    bVar10 = local_348.m_passed;
    uVar14 = extraout_XMM0_Da_01;
    uVar15 = extraout_XMM0_Db_01;
    if ((local_348.m_decomp.field_0.buf[0x17] < '\0') &&
       (local_348.m_decomp.field_0.data.ptr != (char *)0x0)) {
      operator_delete__(local_348.m_decomp.field_0.data.ptr);
      uVar14 = extraout_XMM0_Da_02;
      uVar15 = extraout_XMM0_Db_02;
    }
    dVar3 = doctest::detail::ResultBuilder::log
                      ((ResultBuilder *)&__str,(double)CONCAT44(uVar15,uVar14));
    if (extraout_AL_00 != '\0') {
      pcVar2 = (code *)swi(3);
      (*pcVar2)(SUB84(dVar3,0));
      return;
    }
    if (bVar10 == false) {
      bVar10 = doctest::detail::checkIfShouldThrow((Enum)__str._M_string_length);
      if (bVar10) {
        doctest::detail::throwException();
      }
    }
    if ((aStack_388.buf[0x17] < '\0') &&
       ((void *)CONCAT71(aStack_388._1_7_,aStack_388.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(aStack_388._1_7_,aStack_388.buf[0]));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)init._M_dataplus._M_p != &init.field_2) {
      operator_delete(init._M_dataplus._M_p,
                      CONCAT71(init.field_2._M_allocated_capacity._1_7_,init.field_2._M_local_buf[0]
                              ) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&golden);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&output);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&input);
    __n = __n * 2 + 1;
    if (0x9c4 < __n) {
      tf::Taskflow::~Taskflow(&taskflow);
      tf::Executor::~Executor(&executor);
      return;
    }
  }
  std::__throw_future_error(3);
LAB_00137e89:
  doctest::detail::throwException();
}

Assistant:

void test_exclusive_scan(unsigned W) {
  
  tf::Executor executor(W);
  tf::Taskflow taskflow;

  size_t limit = std::is_same_v<T, std::string> ? 2500 : 250000;
  
  for(size_t n=0; n<=limit; n=n*2+1) {

    taskflow.clear();
    
    std::vector<T> input(n), output(n), golden(n); 
    typename std::vector<T>::iterator sbeg, send, dbeg;

    for(size_t i=0; i<n; i++) {
      if constexpr(std::is_same_v<T, std::string>) {
        input[i] = std::to_string(::rand() % 10);
      }
      else {
        input[i] = ::rand() % 10;
      }
    }
    
    T init;
    if constexpr(std::is_same_v<T, std::string>) {
      init = std::to_string(::rand() % 10);
    }
    else {
      init = ::rand() % 10;
    }

    std::exclusive_scan(
      input.begin(), input.end(), golden.begin(), init, B()
    );
    
    // out-of-place
    auto task1 = taskflow.exclusive_scan(
      input.begin(), input.end(), output.begin(), init, B()
    );  
    
    // enable stateful capture
    auto alloc = taskflow.emplace([&](){
      sbeg = input.begin();
      send = input.end();
      dbeg = input.begin();
    });
    
    // in-place
    auto task2 = taskflow.exclusive_scan(
      std::ref(sbeg), std::ref(send), std::ref(dbeg), init, B()
    );

    task1.precede(alloc);
    alloc.precede(task2);

    executor.run(taskflow).wait();

    REQUIRE(input == golden);
    REQUIRE(output == golden);
  }
}